

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::output_yosys_src(SystemVerilogCodeGen *this,IRNode *node)

{
  bool bVar1;
  char cVar2;
  reference __in;
  type *ptVar3;
  type_conflict2 *ptVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  string_view __str;
  type *ln;
  type *fn;
  IRNode *node_local;
  SystemVerilogCodeGen *this_local;
  
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::empty(&node->fn_name_ln);
  if (!bVar1) {
    __in = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&node->fn_name_ln,0);
    ptVar3 = std::get<0ul,std::__cxx11::string,unsigned_int>(__in);
    ptVar4 = std::get<1ul,std::__cxx11::string,unsigned_int>(__in);
    __str = indent(this);
    pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,__str);
    poVar6 = std::operator<<(pbVar5,"(* src = \"");
    poVar6 = std::operator<<(poVar6,(string *)ptVar3);
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*ptVar4);
    poVar6 = std::operator<<(poVar6,"\" *)");
    cVar2 = Stream::endl(&this->stream_);
    std::operator<<(poVar6,cVar2);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::output_yosys_src(IRNode* node) {
    if (!node->fn_name_ln.empty()) {
        auto const& [fn, ln] = node->fn_name_ln[0];
        stream_ << indent() << "(* src = \"" << fn << ":" << ln << "\" *)" << stream_.endl();
    }
}